

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

int test_pattern(GlobalVars *gv,char **fpat,char ***spatlist)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  char *name;
  
  if (secdefbase == (char *)0x0) {
    secdefbase = gettxtptr();
    secdefline = getlineno();
  }
  *fpat = (char *)0x0;
  *spatlist = (char **)0x0;
  level = 2;
  do {
    name = getarg('\x05');
    while (name != (char *)0x0) {
      iVar3 = check_command(gv,name,0x8000);
      if (iVar3 == 0) {
        cVar2 = getchr();
        pcVar1 = scriptname;
        if (cVar2 == '(') {
          bVar4 = parse_pattern(gv,name,fpat,spatlist);
          if (bVar4 != 0) {
            return 1;
          }
        }
        else if (cVar2 == '=') {
          do {
            cVar2 = getchr();
            if (cVar2 == '\0') break;
          } while (cVar2 != ';');
        }
        else {
          uVar5 = getlineno();
          error(0x41,pcVar1,(ulong)uVar5,name);
          back(1);
        }
      }
      name = getarg('\x05');
    }
    cVar2 = getchr();
    if (cVar2 != ';') {
      back(1);
      level = 1;
      return 0;
    }
  } while( true );
}

Assistant:

int test_pattern(struct GlobalVars *gv,char **fpat,char ***spatlist)
/* Returns next file/section-patterns, but doesn't execute any commands
   or assignments. It will remember the initial parsing state to
   do it a second time for real with next_pattern(). */
{
  char c,*keyword;

  if (!secdefbase) {
    secdefbase = gettxtptr();
    secdefline = getlineno();
  }
  *fpat = NULL;
  *spatlist = NULL;
  level = 2;

  do {
    while (keyword = getpattern()) {
      if (check_command(gv,keyword,SCMDF_IGNORE)) {
        continue;
      }
      else {
        c = getchr();
        if (c == '=') {
          skip_expr(0);
        }
        else if (c == '(') {
          if (parse_pattern(gv,keyword,fpat,spatlist))
            return 1;
        }
        else {
          /* unknown keyword ignored */
          error(65,scriptname,getlineno(),keyword);
          back(1);
        }
      }
    }
  }
  while (getchr() == ';');
  back(1);

  level = 1;
  return 0;
}